

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

ChArchiveOut * __thiscall
chrono::ChArchiveOut::operator<<
          (ChArchiveOut *this,ChNameValue<std::shared_ptr<chrono::ChShaft>_> *bVal)

{
  ChNameValue<std::shared_ptr<chrono::ChShaft>_> local_28;
  
  local_28._name = bVal->_name;
  local_28._value = bVal->_value;
  local_28._flags = bVal->_flags;
  out<chrono::ChShaft>(this,&local_28);
  return this;
}

Assistant:

ChArchiveOut& operator<<(ChNameValue<T> bVal) {
          this->out(bVal);
          return (*this);
      }